

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

_Bool extract_if_dead(connectdata *conn,Curl_easy *data)

{
  _Bool _Var1;
  curltime cVar2;
  curltime now_00;
  _Bool local_3d;
  uint local_3c;
  _Bool input_pending;
  time_t tStack_38;
  uint state;
  curltime now;
  _Bool dead;
  Curl_easy *data_local;
  connectdata *conn_local;
  
  if ((conn->easyq).size == 0) {
    cVar2 = Curl_now();
    tStack_38 = cVar2.tv_sec;
    now.tv_sec._0_4_ = cVar2.tv_usec;
    now_00._12_4_ = 0;
    now_00.tv_sec = SUB128(cVar2._0_12_,0);
    now_00.tv_usec = SUB124(cVar2._0_12_,8);
    _Var1 = conn_maxage(data,conn,now_00);
    if (_Var1) {
      now._15_1_ = 1;
    }
    else if (conn->handler->connection_check == (_func_uint_Curl_easy_ptr_connectdata_ptr_uint *)0x0
            ) {
      Curl_attach_connection(data,conn);
      _Var1 = Curl_conn_is_alive(data,conn,&local_3d);
      now._15_1_ = (_Var1 ^ 0xffU) & 1;
      if ((local_3d & 1U) != 0) {
        now._15_1_ = 1;
      }
      Curl_detach_connection(data);
    }
    else {
      Curl_attach_connection(data,conn);
      local_3c = (*conn->handler->connection_check)(data,conn,1);
      now._15_1_ = (local_3c & 1) != 0;
      Curl_detach_connection(data);
    }
    if ((now._15_1_ & 1) != 0) {
      if ((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) {
        Curl_infof(data,"Connection %ld seems to be dead",conn->connection_id);
      }
      Curl_conncache_remove_conn(data,conn,false);
      return true;
    }
  }
  return false;
}

Assistant:

static bool extract_if_dead(struct connectdata *conn,
                            struct Curl_easy *data)
{
  if(!CONN_INUSE(conn)) {
    /* The check for a dead socket makes sense only if the connection isn't in
       use */
    bool dead;
    struct curltime now = Curl_now();
    if(conn_maxage(data, conn, now)) {
      /* avoid check if already too old */
      dead = TRUE;
    }
    else if(conn->handler->connection_check) {
      /* The protocol has a special method for checking the state of the
         connection. Use it to check if the connection is dead. */
      unsigned int state;

      /* briefly attach the connection to this transfer for the purpose of
         checking it */
      Curl_attach_connection(data, conn);

      state = conn->handler->connection_check(data, conn, CONNCHECK_ISDEAD);
      dead = (state & CONNRESULT_DEAD);
      /* detach the connection again */
      Curl_detach_connection(data);

    }
    else {
      bool input_pending;

      Curl_attach_connection(data, conn);
      dead = !Curl_conn_is_alive(data, conn, &input_pending);
      if(input_pending) {
        /* For reuse, we want a "clean" connection state. The includes
         * that we expect - in general - no waiting input data. Input
         * waiting might be a TLS Notify Close, for example. We reject
         * that.
         * For protocols where data from other end may arrive at
         * any time (HTTP/2 PING for example), the protocol handler needs
         * to install its own `connection_check` callback.
         */
        dead = TRUE;
      }
      Curl_detach_connection(data);
    }

    if(dead) {
      infof(data, "Connection %" CURL_FORMAT_CURL_OFF_T " seems to be dead",
            conn->connection_id);
      Curl_conncache_remove_conn(data, conn, FALSE);
      return TRUE;
    }
  }
  return FALSE;
}